

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int balance(BtCursor *pCur)

{
  uint N;
  u8 *puVar1;
  byte bVar2;
  u8 uVar3;
  ushort uVar4;
  ushort uVar5;
  u32 uVar6;
  uint *puVar7;
  PgHdr *pPVar8;
  Pgno PVar9;
  u16 *puVar10;
  uint uVar40;
  char cVar11;
  u16 uVar12;
  ushort uVar13;
  u16 uVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  BtCursor *pBVar18;
  undefined1 *puVar19;
  ulong uVar20;
  MemPage *pMVar21;
  undefined7 uVar22;
  uint uVar23;
  int iVar24;
  long lVar25;
  undefined8 *puVar26;
  long *plVar27;
  undefined8 uVar28;
  int iNew;
  long *plVar29;
  MemPage *pMVar30;
  ulong uVar31;
  size_t __n;
  undefined4 *puVar32;
  MemPage *pMVar33;
  long lVar34;
  long lVar35;
  uint uVar36;
  long lVar37;
  ulong uVar38;
  long *plVar39;
  MemPage *pMVar41;
  BtShared *pBVar42;
  MemPage *pMVar43;
  u8 *puVar44;
  Pgno PVar45;
  u16 *puVar46;
  ulong uVar47;
  u8 *puVar48;
  Pgno pgnoNew;
  MemPage *apOld [3];
  int szNew [5];
  u8 abDone [5];
  MemPage *pNew;
  u16 szCell;
  MemPage *pChild;
  u8 *apDiv [2];
  u8 aBalanceQuickSpace [13];
  Pgno aPgno [5];
  int local_274;
  MemPage *local_270;
  char local_261;
  MemPage *local_260;
  MemPage *local_258;
  MemPage *local_250;
  MemPage *local_248;
  ulong local_240;
  ulong local_238;
  MemPage *local_230;
  BtShared *local_228;
  MemPage *local_220;
  ulong local_218;
  MemPage *local_210;
  MemPage *local_208;
  uint local_1fc;
  MemPage *local_1f8;
  undefined8 local_1f0;
  Pgno local_1e8;
  uint local_1e4 [7];
  undefined1 local_1c8 [28];
  uint auStack_1ac [7];
  char local_190 [8];
  u8 *local_188;
  uint local_180;
  Pgno local_17c;
  u16 *local_178;
  u8 *local_170;
  undefined8 local_168;
  long local_160 [5];
  u16 *local_138;
  u16 *local_130;
  undefined1 local_128 [40];
  MemPage *pMStack_100;
  MemPage *local_f8;
  MemPage *pMStack_f0;
  MemPage *local_e8;
  BtShared *pBStack_e0;
  u8 *local_d8;
  u8 *puStack_d0;
  u8 *local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  _func_u16_MemPage_ptr_u8_ptr *p_Stack_b0;
  _func_void_MemPage_ptr_u8_ptr_CellInfo_ptr *local_a8;
  CellInfo local_98;
  MemPage *local_80;
  uint *apuStack_78 [4];
  u8 local_55 [4];
  u8 auStack_51 [9];
  Pgno aPStack_48 [6];
  
  local_1f0 = (u8 *)0x0;
  pMVar33 = pCur->pPage;
  unique0x100032a8 = pCur;
LAB_00165d46:
  if ((pMVar33->nFree < 0) && (iVar15 = btreeComputeFreeSpace(pMVar33), iVar15 != 0)) {
    iVar15 = 0;
  }
  else if (pMVar33->nOverflow == '\0') {
    iVar16 = pMVar33->nFree * 3;
    uVar6 = pCur->pBt->usableSize;
    iVar24 = uVar6 * 2;
    iVar15 = 0;
    if ((iVar16 != iVar24 && SBORROW4(iVar16,iVar24) == (int)(iVar16 + uVar6 * -2) < 0) &&
       (cVar11 = pCur->iPage, cVar11 != '\0')) {
LAB_00165dc7:
      if (pMVar33->pDbPage->nRef < 2) {
        pMVar21 = pCur->apPage[(long)cVar11 + -1];
        uVar13 = pCur->aiIdx[(long)cVar11 + -1];
        iVar15 = sqlite3PagerWrite(pMVar21->pDbPage);
        if ((iVar15 == 0) &&
           ((local_261 = cVar11, local_230 = (MemPage *)(ulong)uVar13, -1 < pMVar21->nFree ||
            (iVar15 = btreeComputeFreeSpace(pMVar21), iVar15 == 0)))) {
          local_210 = pMVar21;
          if (((pMVar33->intKeyLeaf != '\0') &&
              (((pMVar33->nOverflow == '\x01' && (pMVar33->aiOvfl[0] == pMVar33->nCell)) &&
               (pMVar21->pgno != 1)))) && (pMVar21->nCell == (u16)local_230)) {
            if (pMVar33->aiOvfl[0] == 0) {
              sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x127bb);
              pCur = stack0xfffffffffffffe50;
              iVar15 = 0xb;
            }
            else {
              pBVar42 = pMVar33->pBt;
              iVar15 = allocateBtreePage(pBVar42,(MemPage **)&local_168,&local_1e8,0,'\0');
              pCur = stack0xfffffffffffffe50;
              if (iVar15 == 0) {
                local_1c8._0_8_ = pMVar33->apOvfl[0];
                local_128._0_2_ = (*pMVar33->xCellSize)(pMVar33,(u8 *)local_1c8._0_8_);
                pMVar21 = (MemPage *)CONCAT44(local_168._4_4_,(int)local_168);
                zeroPage(pMVar21,0xd);
                local_128._32_4_ = 1;
                local_f8 = (MemPage *)local_1c8;
                pMStack_f0 = (MemPage *)local_128;
                local_e8 = (MemPage *)pMVar33->aDataEnd;
                local_b8 = (DbPage *)CONCAT44(local_b8._4_4_,2);
                pMStack_100 = pMVar33;
                iVar15 = rebuildPage((CellArray *)(local_128 + 0x20),0,1,pMVar21);
                pMVar41 = local_210;
                local_98.nKey._0_4_ = iVar15;
                if (iVar15 == 0) {
                  pMVar21->nFree =
                       (pBVar42->usableSize -
                       ((uint)(ushort)local_128._0_2_ + (uint)pMVar21->cellOffset)) + -2;
                  if ((pBVar42->autoVacuum != '\0') &&
                     (ptrmapPut(pBVar42,local_1e8,'\x05',local_210->pgno,(int *)&local_98),
                     pMVar21->minLocal < (ushort)local_128._0_2_)) {
                    ptrmapPutOvflPtr(pMVar21,pMVar21,(u8 *)local_1c8._0_8_,(int *)&local_98);
                  }
                  uVar47 = (ulong)(CONCAT11(pMVar33->aCellIdx[(ulong)pMVar33->nCell * 2 + -2],
                                            pMVar33->aCellIdx[(ulong)pMVar33->nCell * 2 + -1]) &
                                  pMVar33->maskPage);
                  uVar38 = 0;
                  puVar44 = pMVar33->aData + uVar47;
                  pMVar43 = (MemPage *)(pMVar33->aData + uVar47 + 2);
                  do {
                    pMVar30 = pMVar43;
                    puVar48 = puVar44;
                    if (7 < uVar38) break;
                    uVar38 = uVar38 + 1;
                    puVar44 = puVar48 + 1;
                    pMVar43 = (MemPage *)&pMVar30->intKey;
                  } while ((char)*puVar48 < '\0');
                  lVar25 = 4;
                  do {
                    local_1c8._0_8_ = pMVar30;
                    uVar3 = *(u8 *)((long)&((MemPage *)(local_1c8._0_8_ + -0x88))->xParseCell + 7);
                    local_55[lVar25] = uVar3;
                    lVar25 = lVar25 + 1;
                    if (-1 < (char)uVar3) break;
                    pMVar30 = (MemPage *)&((MemPage *)local_1c8._0_8_)->intKey;
                  } while ((ulong)local_1c8._0_8_ < (MemPage *)(puVar48 + 10));
                  if ((int)local_98.nKey == 0) {
                    insertCell(pMVar41,(uint)pMVar41->nCell,local_55,(int)lVar25,(u8 *)0x0,
                               pMVar33->pgno,(int *)&local_98);
                  }
                  *(Pgno *)(pMVar41->aData + (ulong)pMVar41->hdrOffset + 8) =
                       local_1e8 >> 0x18 | (local_1e8 & 0xff0000) >> 8 | (local_1e8 & 0xff00) << 8 |
                       local_1e8 << 0x18;
                  pCur = stack0xfffffffffffffe50;
                  iVar15 = (int)local_98.nKey;
                  if (pMVar21 != (MemPage *)0x0) {
                    sqlite3PagerUnrefNotNull(pMVar21->pDbPage);
                    pCur = stack0xfffffffffffffe50;
                    iVar15 = (int)local_98.nKey;
                  }
                }
                else {
                  pCur = stack0xfffffffffffffe50;
                  if (pMVar21 != (MemPage *)0x0) {
                    sqlite3PagerUnrefNotNull(pMVar21->pDbPage);
                    pCur = stack0xfffffffffffffe50;
                  }
                }
              }
            }
            goto LAB_00166456;
          }
          local_188 = (u8 *)pcache1Alloc(pCur->pBt->pageSize);
          local_190[0] = '\0';
          local_190[1] = '\0';
          local_190[2] = '\0';
          local_190[3] = '\0';
          local_190[4] = 0;
          local_128._32_8_ = (MemPage *)0x0;
          pMStack_100 = (MemPage *)0x0;
          local_f8 = (MemPage *)0x0;
          pMStack_f0 = (MemPage *)0x0;
          local_e8 = (MemPage *)0x0;
          pBStack_e0 = (BtShared *)0x0;
          local_d8 = (u8 *)0x0;
          puStack_d0 = (u8 *)0x0;
          local_c8 = (u8 *)0x0;
          uStack_c0 = (u8 *)0x0;
          local_b8 = (DbPage *)0x0;
          p_Stack_b0 = (_func_u16_MemPage_ptr_u8_ptr *)0x0;
          local_a8 = (_func_void_MemPage_ptr_u8_ptr_CellInfo_ptr *)0x0;
          if (local_188 != (u8 *)0x0) {
            uVar36 = pCur->hints & 1;
            local_170 = (u8 *)(ulong)uVar36;
            uVar40 = (uint)pMVar21->nCell + (uint)pMVar21->nOverflow;
            local_218 = 0;
            if (1 < uVar40) {
              uVar23 = (uint)local_230;
              if (uVar23 == 0) {
                local_218 = 0;
              }
              else {
                if (uVar40 == uVar23) {
                  uVar23 = (uVar23 + uVar36) - 2;
                }
                else {
                  uVar23 = uVar23 - 1;
                }
                local_218 = (ulong)uVar23;
              }
              uVar40 = 2 - uVar36;
            }
            local_208 = (MemPage *)(ulong)uVar40;
            uVar36 = ((int)local_218 - (uint)pMVar21->nOverflow) + uVar40;
            if (uVar36 == pMVar21->nCell) {
              uVar47 = (ulong)pMVar21->hdrOffset + 8;
            }
            else {
              uVar47 = (ulong)(CONCAT11(pMVar21->aCellIdx[(long)(int)uVar36 * 2],
                                        pMVar21->aCellIdx[(long)(int)uVar36 * 2 + 1]) &
                              pMVar21->maskPage);
            }
            apuStack_78[3] = (uint *)(pMVar21->aData + uVar47);
            local_228 = pMVar21->pBt;
            local_1fc = uVar40 + 1;
            uVar36 = *apuStack_78[3];
            PVar45 = uVar36 >> 0x18 | (uVar36 & 0xff0000) >> 8 | (uVar36 & 0xff00) << 8 |
                     uVar36 << 0x18;
            __n = (size_t)(uVar40 * 8);
            local_270 = (MemPage *)((long)(int)local_218 + -1);
            local_240 = 0;
            pMVar21 = local_208;
            local_250 = pMVar33;
            local_80 = local_208;
            do {
              iVar15 = getAndInitPage(local_228,PVar45,(MemPage **)(local_1c8 + __n),(BtCursor *)0x0
                                      ,0);
              pMVar33 = pMVar21;
              local_274 = iVar15;
              if (iVar15 != 0) break;
              pMVar33 = *(MemPage **)(local_1c8 + (long)pMVar21 * 8);
              if ((pMVar33->nFree < 0) &&
                 (iVar15 = btreeComputeFreeSpace(pMVar33), local_274 = iVar15, iVar15 != 0))
              goto LAB_001663bf;
              pMVar41 = local_210;
              iVar15 = (int)local_240 + (uint)pMVar33->nCell;
              uVar47 = (ulong)(iVar15 + 4);
              pMVar33 = (MemPage *)((long)&pMVar21[-1].xParseCell + 7);
              if (pMVar21 == (MemPage *)0x0) {
                uVar40 = iVar15 + 7;
                uVar36 = uVar40 & 0x7ffffffc;
                local_17c = PVar45;
                local_f8 = (MemPage *)sqlite3Malloc((long)(int)(uVar36 * 10 + local_228->pageSize));
                pMVar33 = local_250;
                if (local_f8 == (MemPage *)0x0) {
                  iVar15 = 7;
                  uVar36 = 0;
                  goto LAB_001663db;
                }
                pMVar21 = (MemPage *)(local_f8->aiOvfl + (ulong)uVar36 * 4 + -0xe);
                pMStack_f0 = pMVar21;
                local_130 = pMVar21->aiOvfl + ((ulong)uVar36 - 0xe);
                pMStack_100 = (MemPage *)local_1c8._0_8_;
                local_180 = (uint)*(u8 *)(local_1c8._0_8_ + 8);
                local_178 = (u16 *)((ulong)*(u8 *)(local_1c8._0_8_ + 8) << 2);
                local_1f8 = (MemPage *)local_1c8._0_8_;
                local_240 = (ulong)*(u8 *)(local_1c8._0_8_ + 2);
                local_258 = (MemPage *)(ulong)local_1fc;
                local_138 = local_f8->aiOvfl + (ulong)(uVar40 >> 2 & 0x1fffffff) * 0x14 + -0xe;
                pMVar41 = (MemPage *)0x0;
                uVar47 = 0;
                iVar15 = 0;
                local_260 = local_f8;
                local_220 = pMVar21;
                goto LAB_0016655e;
              }
              local_240 = uVar47;
              if (local_210->nOverflow == 0) {
                iVar15 = (int)pMVar21 + (uint)local_270;
LAB_001662bb:
                puVar44 = local_210->aData;
                lVar25 = (long)(int)(iVar15 - (uint)local_210->nOverflow);
                uVar13 = CONCAT11(local_210->aCellIdx[lVar25 * 2],
                                  local_210->aCellIdx[lVar25 * 2 + 1]) & local_210->maskPage;
                puVar7 = (uint *)(puVar44 + uVar13);
                apuStack_78[(long)pMVar33] = puVar7;
                local_238 = CONCAT44(local_238._4_4_,*(undefined4 *)(puVar44 + uVar13));
                uVar12 = (*local_210->xCellSize)(local_210,(u8 *)puVar7);
                auStack_1ac[(long)&(pMVar33 + -1)[1].intKey] = (uint)uVar12;
                if (((local_228->btsFlags & 0xc) != 0) &&
                   (iVar16 = (int)puVar7 - *(int *)&pMVar41->aData,
                   (int)(iVar16 + (uint)uVar12) <= (int)local_228->usableSize)) {
                  memcpy(local_188 + iVar16,puVar7,(ulong)(uint)uVar12);
                  apuStack_78[(long)pMVar33] =
                       (uint *)(local_188 + ((long)puVar7 - (long)pMVar41->aData));
                }
                PVar45 = (uint)local_238 >> 0x18 | ((uint)local_238 & 0xff0000) >> 8 |
                         ((uint)local_238 & 0xff00) << 8 | (uint)local_238 << 0x18;
                dropCell(pMVar41,iVar15 - (uint)pMVar41->nOverflow,(uint)uVar12,&local_274);
                iVar15 = local_274;
              }
              else {
                if ((int)pMVar21 + (uint)local_270 != (uint)local_210->aiOvfl[0]) {
                  iVar15 = (int)local_218 + (int)pMVar33;
                  goto LAB_001662bb;
                }
                puVar7 = (uint *)local_210->apOvfl[0];
                apuStack_78[(long)pMVar33] = puVar7;
                uVar36 = *puVar7;
                PVar45 = uVar36 >> 0x18 | (uVar36 & 0xff0000) >> 8 | (uVar36 & 0xff00) << 8 |
                         uVar36 << 0x18;
                uVar12 = (*local_210->xCellSize)(local_210,(u8 *)puVar7);
                auStack_1ac[(long)&(pMVar33 + -1)[1].intKey] = (uint)uVar12;
                pMVar41->nOverflow = '\0';
                iVar15 = 0;
              }
              __n = __n - 8;
              pMVar21 = pMVar33;
            } while (iVar15 == 0);
            __n = ((long)pMVar33 << 0x20) + 0x100000000 >> 0x1d;
LAB_001663bf:
            uVar36 = 0;
            memset(local_1c8,0,__n);
            pMVar33 = local_250;
            goto LAB_001663c9;
          }
          iVar15 = 7;
          goto LAB_00166434;
        }
        goto LAB_00166456;
      }
      uVar28 = 0x12c33;
LAB_00167864:
      iVar15 = 0xb;
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar28,
                  "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
    }
  }
  else {
    cVar11 = pCur->iPage;
    if (cVar11 != '\0') goto LAB_00165dc7;
    for (pBVar18 = pCur->pBt->pCursor; pBVar18 != (BtCursor *)0x0; pBVar18 = pBVar18->pNext) {
      if (((pBVar18 != pCur) && (pBVar18->eState == '\0')) && (pBVar18->pPage == pCur->pPage)) {
        uVar28 = 0x12bf7;
        goto LAB_00167864;
      }
    }
    local_128._32_8_ = (MemPage *)0x0;
    local_1c8._0_8_ = local_1c8._0_8_ & 0xffffffff00000000;
    pBVar42 = pMVar33->pBt;
    iVar15 = sqlite3PagerWrite(pMVar33->pDbPage);
    if (iVar15 == 0) {
      local_168._0_4_ =
           allocateBtreePage(pBVar42,(MemPage **)(local_128 + 0x20),(Pgno *)local_1c8,pMVar33->pgno,
                             '\0');
      pMVar21 = (MemPage *)local_128._32_8_;
      copyNodeContent(pMVar33,(MemPage *)local_128._32_8_,(int *)&local_168);
      if (pBVar42->autoVacuum != '\0') {
        ptrmapPut(pBVar42,local_1c8._0_4_,'\x05',pMVar33->pgno,(int *)&local_168);
      }
      iVar15 = (int)local_168;
      if ((int)local_168 == 0) {
        memcpy((u16 *)((long)pMVar21 + 0x1c),pMVar33->aiOvfl,(ulong)((uint)pMVar33->nOverflow * 2));
        memcpy((u8 **)((long)pMVar21 + 0x28),pMVar33->apOvfl,(ulong)pMVar33->nOverflow << 3);
        *(u8 *)((long)pMVar21 + 0xc) = pMVar33->nOverflow;
        zeroPage(pMVar33,**(u8 **)((long)pMVar21 + 0x50) & 0xfffffff7);
        *(uint *)(pMVar33->aData + (ulong)pMVar33->hdrOffset + 8) =
             (uint)local_1c8._0_4_ >> 0x18 | (local_1c8._0_4_ & 0xff0000) >> 8 |
             (local_1c8._0_4_ & 0xff00) << 8 | local_1c8._0_4_ << 0x18;
        stack0xfffffffffffffe50->apPage[1] = pMVar21;
        stack0xfffffffffffffe50->iPage = '\x01';
        stack0xfffffffffffffe50->ix = 0;
        stack0xfffffffffffffe50->aiIdx[0] = 0;
        stack0xfffffffffffffe50->apPage[0] = pMVar33;
        iVar15 = 0;
        pCur = stack0xfffffffffffffe50;
        goto LAB_00166479;
      }
      stack0xfffffffffffffe50->apPage[1] = (MemPage *)0x0;
      if (pMVar21 != (MemPage *)0x0) {
        sqlite3PagerUnrefNotNull(*(DbPage **)((long)pMVar21 + 0x70));
      }
    }
    else {
      stack0xfffffffffffffe50->apPage[1] = (MemPage *)0x0;
    }
  }
  goto LAB_0016786b;
LAB_0016655e:
  do {
    lVar25 = *(long *)(local_1c8 + (long)pMVar41 * 8);
    puVar44 = *(u8 **)(lVar25 + 0x50);
    if (*puVar44 != *local_1f8->aData) {
      uVar28 = 0x12960;
      goto LAB_00166cac;
    }
    local_248 = (MemPage *)(ulong)*(ushort *)(lVar25 + 0x18);
    uVar13 = *(ushort *)(lVar25 + 0x1a);
    puVar48 = puVar44 + *(ushort *)(lVar25 + 0x12);
    lVar34 = (long)iVar15;
    local_270 = pMVar41;
    local_238 = uVar47;
    memset(pMVar21->aiOvfl + lVar34 + -0xe,0,
           (ulong)(((uint)*(ushort *)(lVar25 + 0x18) + (uint)*(byte *)(lVar25 + 0xc)) * 2));
    pMVar21 = local_220;
    pMVar33 = local_250;
    bVar2 = *(byte *)(lVar25 + 0xc);
    if ((ulong)bVar2 != 0) {
      uVar4 = *(ushort *)(lVar25 + 0x1c);
      if ((ushort)local_248 < uVar4) {
        uVar36 = 0;
        uVar28 = 0x12978;
        goto LAB_00166d0b;
      }
      if (uVar4 != 0) {
        lVar35 = lVar34 << 0x20;
        lVar37 = 0;
        do {
          *(u8 **)(local_260->aiOvfl + lVar34 * 4 + lVar37 * 2 + -0xe) =
               puVar44 + (uVar13 & CONCAT11(puVar48[lVar37],puVar48[lVar37 + 1]));
          lVar35 = lVar35 + 0x100000000;
          lVar37 = lVar37 + 2;
        } while ((uint)uVar4 * 2 != (int)lVar37);
        lVar34 = lVar35 >> 0x20;
        puVar48 = puVar48 + lVar37;
      }
      uVar47 = 0;
      do {
        *(undefined8 *)(local_260->aiOvfl + lVar34 * 4 + uVar47 * 4 + -0xe) =
             *(undefined8 *)(lVar25 + 0x28 + uVar47 * 8);
        uVar47 = uVar47 + 1;
      } while (bVar2 != uVar47);
      iVar15 = (int)lVar34 + (int)uVar47;
      local_128._32_4_ = iVar15;
    }
    uVar4 = *(ushort *)(lVar25 + 0x12);
    uVar5 = *(ushort *)(lVar25 + 0x18);
    if (puVar48 < puVar44 + (ulong)uVar5 * 2 + (ulong)uVar4) {
      lVar34 = (long)iVar15;
      lVar35 = 0;
      do {
        puVar1 = puVar48 + lVar35;
        *(u8 **)(local_260->aiOvfl + lVar34 * 4 + lVar35 * 2 + -0xe) =
             puVar44 + (CONCAT11(*puVar1,puVar1[1]) & uVar13);
        iVar15 = iVar15 + 1;
        local_128._32_4_ = iVar15;
        lVar35 = lVar35 + 2;
      } while (puVar1 + 2 < puVar44 + (ulong)uVar5 * 2 + (ulong)uVar4);
    }
    *(int *)(local_128 + (long)local_270 * 4) = iVar15;
    uVar47 = local_238;
    if ((local_270 < local_208) && ((char)local_240 == '\0')) {
      uVar36 = auStack_1ac[(long)&(local_270 + -1)[1].intKey] & 0xffff;
      lVar34 = (long)iVar15;
      local_220->aiOvfl[lVar34 + -0xe] = (u16)auStack_1ac[(long)&(local_270 + -1)[1].intKey];
      puVar19 = (undefined1 *)((long)local_130 + (long)(int)local_238);
      local_238 = (ulong)((int)local_238 + uVar36);
      memcpy(puVar19,apuStack_78[(long)local_270],(ulong)uVar36);
      puVar32 = (undefined4 *)(puVar19 + (long)local_178);
      *(undefined4 **)(local_260->aiOvfl + lVar34 * 4 + -0xe) = puVar32;
      uVar13 = pMVar21->aiOvfl[lVar34 + -0xe] - (short)local_178;
      pMVar21->aiOvfl[lVar34 + -0xe] = uVar13;
      uVar47 = local_238;
      if (*(char *)(lVar25 + 8) == '\0') {
        *puVar32 = *(undefined4 *)(*(long *)(lVar25 + 0x50) + 8);
      }
      else if (uVar13 < 4) {
        puVar19 = (undefined1 *)((long)(int)local_238 + (long)local_138);
        do {
          *puVar19 = 0;
          uVar13 = pMVar21->aiOvfl[lVar34 + -0xe] + 1;
          pMVar21->aiOvfl[lVar34 + -0xe] = uVar13;
          puVar19 = puVar19 + 1;
          uVar47 = (ulong)((int)uVar47 + 1);
        } while (uVar13 < 4);
      }
      iVar15 = iVar15 + 1;
      local_128._32_4_ = iVar15;
    }
    pMVar41 = (MemPage *)&local_270->intKey;
  } while (pMVar41 != local_258);
  local_138 = (u16 *)((ulong)local_178 & 0xffff);
  local_238 = CONCAT44(local_238._4_4_,local_228->usableSize + (uint)(ushort)local_178 + -0xc);
  lVar25 = 0;
  iVar15 = 0;
  do {
    lVar34 = *(long *)(local_1c8 + lVar25 * 8);
    lVar35 = (long)iVar15;
    (&pMStack_f0)[lVar35 + 1] = *(MemPage **)(lVar34 + 0x58);
    uVar36 = *(uint *)(local_128 + lVar25 * 4);
    *(uint *)((long)&local_b8 + lVar35 * 4) = uVar36;
    iVar16 = 0;
    if ((iVar15 != 0) &&
       (iVar16 = iVar15 + -1, uVar36 != *(uint *)((long)&uStack_c0 + lVar35 * 4 + 4))) {
      iVar16 = iVar15;
    }
    if ((int)local_240 == 0) {
      lVar35 = (long)iVar16;
      iVar16 = iVar16 + 1;
      (&pBStack_e0)[lVar35] = (BtShared *)local_210->aDataEnd;
      *(uint *)((long)&local_b8 + lVar35 * 4 + 4) = uVar36 + 1;
    }
    uVar40 = (uint)local_238 - *(int *)(lVar34 + 0x14);
    auStack_1ac[lVar25 + 1] = uVar40;
    if (*(char *)(lVar34 + 0xc) != '\0') {
      uVar47 = 0;
      do {
        uVar13 = (**(code **)(lVar34 + 0x78))(lVar34);
        uVar40 = uVar40 + uVar13 + 2;
        auStack_1ac[lVar25 + 1] = uVar40;
        uVar47 = uVar47 + 1;
      } while (uVar47 < *(byte *)(lVar34 + 0xc));
    }
    local_1e4[lVar25 + -1] = uVar36;
    lVar25 = lVar25 + 1;
    iVar15 = iVar16 + 1;
  } while ((MemPage *)lVar25 != local_258);
  local_270 = (MemPage *)CONCAT44(local_270._4_4_,local_128._32_4_);
  local_220 = (MemPage *)(long)(int)local_128._32_4_;
  local_248 = (MemPage *)-(long)local_220;
  pMVar41 = (MemPage *)(ulong)local_1fc;
  local_258 = pMStack_f0;
  pMVar21 = pMStack_f0;
  uVar47 = 0;
  do {
    uVar36 = auStack_1ac[uVar47 + 1];
    if ((int)(uint)local_238 < (int)uVar36) {
      local_260 = (MemPage *)CONCAT44(local_260._4_4_,(int)uVar47 + 2);
      do {
        if ((long)(int)pMVar41 <= (long)(uVar47 + 1)) {
          if (3 < uVar47) {
            auStack_1ac[uVar47 + 1] = uVar36;
            uVar36 = 0;
            uVar28 = 0x129dd;
            goto LAB_00166d0b;
          }
          auStack_1ac[uVar47 + 2] = 0;
          local_1e4[uVar47] = (uint)local_270;
          pMVar41 = (MemPage *)((ulong)local_260 & 0xffffffff);
        }
        uVar40 = local_1e4[uVar47 - 1];
        lVar25 = (long)(int)uVar40;
        uVar38 = lVar25 - 1;
        uVar12 = pMVar21->aiOvfl[lVar25 + -0xf];
        if (uVar12 == 0) {
          uVar12 = computeCellSize((CellArray *)(local_128 + 0x20),(uint)uVar38);
          pMVar21 = local_258;
        }
        iVar15 = uVar12 + 2;
        if ((int)local_240 == 0) {
          iVar15 = 0;
          if ((int)uVar40 < (int)(uint)local_270) {
            uVar14 = pMVar21->aiOvfl[lVar25 + -0xe];
            if (uVar14 == 0) {
              uVar14 = computeCellSize((CellArray *)(local_128 + 0x20),uVar40);
              pMVar21 = local_258;
            }
            iVar15 = uVar14 + 2;
          }
        }
        auStack_1ac[uVar47 + 2] = auStack_1ac[uVar47 + 2] + iVar15;
        uVar36 = uVar36 - (uVar12 + 2);
        local_1e4[uVar47 - 1] = (uint)uVar38;
      } while ((int)(uint)local_238 < (int)uVar36);
    }
    else {
      uVar38 = (ulong)local_1e4[uVar47 - 1];
    }
    uVar20 = uVar47 + 1;
    auStack_1ac[uVar47 + 1] = uVar36;
    if ((int)uVar38 < (int)(uint)local_270) {
      local_260 = pMVar41;
      lVar25 = (long)(int)uVar38;
      do {
        uVar12 = pMVar21->aiOvfl[lVar25 + -0xe];
        iVar15 = (int)uVar38;
        if (uVar12 == 0) {
          uVar12 = computeCellSize((CellArray *)(local_128 + 0x20),iVar15);
          pMVar21 = local_258;
          pMVar41 = local_260;
        }
        uVar36 = uVar36 + uVar12 + 2;
        if ((int)(uint)local_238 < (int)uVar36) {
          if (uVar47 == 0) {
            iVar16 = 0;
          }
          else {
            iVar16 = *(int *)((long)&local_1f0 + uVar47 * 4 + 4);
          }
          if (iVar16 < iVar15) goto LAB_00166aa8;
          uVar36 = 0;
          uVar28 = 0x129fe;
          goto LAB_00166d0b;
        }
        uVar40 = iVar15 + 1;
        uVar38 = (ulong)uVar40;
        auStack_1ac[uVar47 + 1] = uVar36;
        local_1e4[uVar47 - 1] = uVar40;
        if ((int)local_240 == 0) {
          iVar15 = 0;
          if (lVar25 + 1 < (long)local_220) {
            uVar12 = pMVar21->aiOvfl[lVar25 + -0xd];
            if (uVar12 == 0) {
              uVar12 = computeCellSize((CellArray *)(local_128 + 0x20),uVar40);
              pMVar21 = local_258;
              pMVar41 = local_260;
            }
            goto LAB_00166a68;
          }
        }
        else {
LAB_00166a68:
          iVar15 = uVar12 + 2;
        }
        auStack_1ac[uVar47 + 2] = auStack_1ac[uVar47 + 2] - iVar15;
        lVar34 = lVar25 + -0x1b;
        lVar25 = lVar25 + 1;
      } while ((long)local_248->aiOvfl + lVar34 != 0);
    }
    pMVar41 = (MemPage *)(uVar20 & 0xffffffff);
LAB_00166aa8:
    uVar47 = uVar20;
  } while ((long)uVar20 < (long)(int)pMVar41);
  local_130 = (u16 *)(ulong)((int)pMVar41 - 1);
  pMVar43 = (MemPage *)((long)pMVar21 - (ulong)(uint)((int)local_240 * 2));
  puVar46 = local_130;
  local_260 = pMVar41;
  local_220 = pMVar43;
  do {
    pMVar33 = local_250;
    if ((int)puVar46 < 1) {
      local_248 = (MemPage *)CONCAT44(local_248._4_4_,(uint)*local_1f8->aData);
      if ((int)pMVar41 < 1) {
        uVar36 = 0;
        goto LAB_0016708d;
      }
      local_230 = (MemPage *)(ulong)(uint)((int)local_230 - (int)local_218);
      pMVar41 = (MemPage *)((ulong)pMVar41 & 0xffffffff);
      pMVar21 = (MemPage *)0x0;
      local_258 = (MemPage *)((ulong)local_258 & 0xffffffff00000000);
      local_260 = pMVar41;
      goto LAB_00166eec;
    }
    uVar36 = auStack_1ac[(long)puVar46];
    uVar40 = auStack_1ac[(long)((long)puVar46 + 1)];
    uVar23 = *(uint *)((long)&local_1f0 + (long)puVar46 * 4 + 4);
    lVar25 = (long)(int)uVar23 - local_240;
    if (*(short *)((long)pMVar21 + lVar25 * 2) == 0) {
      computeCellSize((CellArray *)(local_128 + 0x20),(int)lVar25);
      pMVar21 = local_258;
      pMVar41 = local_260;
      pMVar43 = local_220;
    }
    local_178 = puVar46;
    local_248 = (MemPage *)(ulong)((uint)(puVar46 == local_130) * 2 - 2);
    lVar25 = (long)(int)uVar23 + 1;
    do {
      N = uVar23 - 1;
      if (pMVar21->aiOvfl[lVar25 + -0x10] == 0) {
        computeCellSize((CellArray *)(local_128 + 0x20),N);
        pMVar21 = local_258;
        pMVar41 = local_260;
        pMVar43 = local_220;
      }
      if (uVar40 == 0) {
        uVar13 = pMVar21->aiOvfl[lVar25 + -0x10];
        uVar17 = pMVar43->aiOvfl[lVar25 + -0xf] + 2;
      }
      else {
        if ((char)local_170 != '\0') break;
        uVar17 = pMVar43->aiOvfl[lVar25 + -0xf] + uVar40 + 2;
        uVar13 = pMVar21->aiOvfl[lVar25 + -0x10];
        if ((int)(((int)local_248 + uVar36) - (uint)uVar13) < (int)uVar17) break;
      }
      uVar36 = (uVar36 - uVar13) - 2;
      local_1e4[(long)(puVar46 + -1)] = N;
      lVar25 = lVar25 + -1;
      uVar23 = N;
      uVar40 = uVar17;
    } while (1 < lVar25);
    puVar10 = local_178;
    auStack_1ac[(long)((long)local_178 + 1)] = uVar40;
    auStack_1ac[(long)(puVar46 + -1 + 1)] = uVar36;
    uVar36 = 0;
    if (puVar10 != (u16 *)0x1) {
      uVar36 = local_1e4[(ulong)((int)puVar10 - 2) - 1];
    }
    puVar46 = (u16 *)((long)puVar46 + -1);
  } while ((int)uVar36 < (int)uVar23);
  uVar28 = 0x12a28;
  pMVar33 = local_250;
LAB_00166cac:
  sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar28);
  uVar36 = 0;
  iVar15 = 0xb;
  goto LAB_001663c9;
LAB_00166eec:
  do {
    pBVar42 = local_228;
    if (pMVar21 <= local_208) {
      lVar25 = *(long *)(local_1c8 + (long)pMVar21 * 8);
      local_160[(long)((long)&pMVar21[-1].xParseCell + 7)] = lVar25;
      *(undefined8 *)(local_1c8 + (long)pMVar21 * 8) = 0;
      local_274 = sqlite3PagerWrite(*(PgHdr **)(lVar25 + 0x70));
      local_258 = (MemPage *)CONCAT44(local_258._4_4_,(uint)local_258 + 1);
      if (((local_230 == pMVar21) + 1 == (int)*(short *)(*(long *)(lVar25 + 0x70) + 0x36)) ||
         (local_274 != 0)) {
        iVar15 = local_274;
        if (local_274 == 0) goto LAB_00167004;
      }
      else {
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12a49);
        iVar15 = 0xb;
      }
LAB_0016766d:
      uVar36 = (uint)local_258;
      goto LAB_001663c9;
    }
    PVar45 = 1;
    if ((char)local_170 == '\0') {
      PVar45 = local_17c;
    }
    local_274 = allocateBtreePage(local_228,(MemPage **)&local_98,&local_17c,PVar45,'\0');
    iVar15 = local_274;
    if (local_274 != 0) goto LAB_0016766d;
    pMVar43 = (MemPage *)CONCAT44(local_98.nKey._4_4_,(int)local_98.nKey);
    zeroPage(pMVar43,(int)local_248);
    local_160[(long)((long)&pMVar21[-1].xParseCell + 7)] = (long)pMVar43;
    local_258 = (MemPage *)CONCAT44(local_258._4_4_,(uint)local_258 + 1);
    *(uint *)(local_128 + (long)pMVar21 * 4) = (uint)local_270;
    pMVar41 = local_260;
    if ((pBVar42->autoVacuum != '\0') &&
       (ptrmapPut(pBVar42,pMVar43->pgno,'\x05',local_210->pgno,&local_274), pMVar41 = local_260,
       iVar15 = local_274, local_274 != 0)) goto LAB_0016766d;
LAB_00167004:
    pMVar21 = (MemPage *)&pMVar21->intKey;
  } while (pMVar41 != pMVar21);
  uVar36 = (uint)local_258;
  if ((int)(uint)local_258 < 1) {
LAB_0016708d:
    uVar38 = (ulong)uVar36;
    iVar15 = uVar36 - 1;
    local_230 = (MemPage *)((ulong)local_230 & 0xffffffff00000000);
    local_1f8 = (MemPage *)((ulong)local_1f8 & 0xffffffff00000000);
    pBVar42 = local_228;
  }
  else {
    uVar38 = (ulong)local_258 & 0xffffffff;
    uVar47 = 0;
    do {
      aPStack_48[uVar47] = *(Pgno *)(local_160[uVar47 - 1] + 4);
      uVar47 = uVar47 + 1;
    } while (uVar38 != uVar47);
    pBVar42 = local_228;
    if ((uint)local_258 == 1) {
      local_1f8 = (MemPage *)CONCAT44(local_1f8._4_4_,(int)CONCAT71((int7)(uVar47 >> 8),1));
      uVar38 = 1;
      local_230 = (MemPage *)((ulong)local_230 & 0xffffffff00000000);
      iVar15 = 0;
    }
    else {
      uVar36 = (uint)local_258 - 1;
      local_258 = (MemPage *)CONCAT44(local_258._4_4_,uVar36);
      puVar44 = (u8 *)(ulong)uVar36;
      uVar47 = 1;
      pMVar33 = (MemPage *)0x0;
      local_170 = puVar44;
      do {
        uVar31 = (ulong)pMVar33 & 0xffffffff;
        uVar20 = uVar47;
        do {
          uVar36 = (uint)uVar20;
          if (*(uint *)(local_160[(long)(int)(uint)uVar31 + -1] + 4) <=
              *(uint *)(local_160[uVar20 - 1] + 4)) {
            uVar36 = (uint)uVar31;
          }
          uVar20 = uVar20 + 1;
          uVar31 = (ulong)uVar36;
        } while (uVar38 != uVar20);
        pMVar21 = (MemPage *)(ulong)uVar36;
        if (pMVar33 != (MemPage *)(ulong)uVar36) {
          pMVar21 = (MemPage *)local_160[(long)((long)&pMVar33[-1].xParseCell + 7)];
          PVar45 = pMVar21->pgno;
          lVar25 = local_160[(long)(int)uVar36 + -1];
          local_260 = (MemPage *)CONCAT44(local_260._4_4_,*(undefined4 *)(lVar25 + 4));
          uVar36 = (uint)sqlite3PendingByte / local_228->pageSize;
          pPVar8 = pMVar21->pDbPage;
          local_1f8 = (MemPage *)CONCAT62(local_1f8._2_6_,pPVar8->flags);
          uVar12 = *(u16 *)(*(long *)(lVar25 + 0x70) + 0x34);
          local_230 = (MemPage *)CONCAT62(local_230._2_6_,uVar12);
          pPVar8->flags = uVar12;
          local_220 = pMVar21;
          sqlite3PcacheMove(pPVar8,uVar36 + 1);
          pPVar8 = *(PgHdr **)(lVar25 + 0x70);
          pPVar8->flags = (u16)local_1f8;
          sqlite3PcacheMove(pPVar8,PVar45);
          pPVar8 = pMVar21->pDbPage;
          pPVar8->flags = (u16)local_230;
          PVar9 = (Pgno)local_260;
          sqlite3PcacheMove(pPVar8,(Pgno)local_260);
          local_220->pgno = PVar9;
          *(Pgno *)(lVar25 + 4) = PVar45;
          pMVar21 = local_220;
          pBVar42 = local_228;
          puVar44 = local_170;
        }
        pMVar33 = (MemPage *)&pMVar33->intKey;
        uVar47 = uVar47 + 1;
      } while (pMVar33 != (MemPage *)puVar44);
      uVar22 = (undefined7)((ulong)pMVar21 >> 8);
      local_230 = (MemPage *)CONCAT44(local_230._4_4_,(int)CONCAT71(uVar22,1));
      local_1f8 = (MemPage *)CONCAT44(local_1f8._4_4_,(int)CONCAT71(uVar22,1));
      iVar15 = (uint)local_258;
    }
  }
  lVar25 = (&local_168)[iVar15];
  uVar36 = *(uint *)(lVar25 + 4);
  *apuStack_78[3] =
       uVar36 >> 0x18 | (uVar36 & 0xff0000) >> 8 | (uVar36 & 0xff00) << 8 | uVar36 << 0x18;
  uVar36 = (uint)uVar38;
  if ((((ulong)local_248 & 8) == 0) && (local_1fc != uVar36)) {
    puVar26 = (undefined8 *)local_1c8;
    if ((int)local_1fc < (int)uVar36) {
      puVar26 = &local_168;
    }
    *(undefined4 *)(*(long *)(lVar25 + 0x50) + 8) =
         *(undefined4 *)(*(long *)(puVar26[(long)local_208] + 0x50) + 8);
  }
  local_258 = (MemPage *)CONCAT44(local_258._4_4_,iVar15);
  if (0 < (int)(uint)local_270 && pBVar42->autoVacuum != '\0') {
    uVar40 = (uint)((int)local_240 == 0);
    pMVar21 = (MemPage *)CONCAT44(local_168._4_4_,(int)local_168);
    pMVar43 = (MemPage *)(ulong)((uint)pMVar21->nCell + (uint)pMVar21->nOverflow);
    pMVar33 = (MemPage *)0x0;
    iVar16 = 0;
    local_260 = (MemPage *)((ulong)local_260 & 0xffffffff00000000);
    local_208 = (MemPage *)CONCAT44(local_208._4_4_,(uint)((int)local_240 == 0));
    pMVar41 = pMVar21;
    do {
      if (pMVar33 == pMVar43) {
        lVar25 = (long)iVar16;
        plVar27 = (long *)(local_1c8 + lVar25 * 8 + 8);
        plVar29 = local_160 + lVar25;
        do {
          lVar25 = lVar25 + 1;
          plVar39 = plVar27;
          if (lVar25 < (int)uVar36) {
            plVar39 = plVar29;
          }
          pMVar21 = (MemPage *)*plVar39;
          pMVar43 = (MemPage *)
                    (ulong)((int)pMVar43 + uVar40 + (uint)pMVar21->nCell + (uint)pMVar21->nOverflow)
          ;
          iVar16 = iVar16 + 1;
          plVar27 = plVar27 + 1;
          plVar29 = plVar29 + 1;
        } while (pMVar33 == pMVar43);
      }
      pMVar30 = *(MemPage **)(local_f8->aiOvfl + (long)pMVar33 * 4 + -0xe);
      lVar25 = (long)(int)(Pgno)local_260;
      if (pMVar33 == (MemPage *)(ulong)local_1e4[lVar25 + -1]) {
        local_260 = (MemPage *)CONCAT44(local_260._4_4_,(Pgno)local_260 + 1);
        pMVar41 = (MemPage *)local_160[lVar25];
        if ((int)local_240 != 0) goto LAB_001671dc;
LAB_001671fd:
        iVar15 = (uint)local_270;
      }
      else {
LAB_001671dc:
        if ((((iVar16 < (int)uVar36) && (pMVar41->pgno == aPStack_48[iVar16])) &&
            ((MemPage *)pMVar21->aData <= pMVar30)) && (pMVar30 < (MemPage *)pMVar21->aDataEnd))
        goto LAB_001671fd;
        local_248 = pMVar33;
        if ((char)local_180 == '\0') {
          uVar40._0_1_ = pMVar30->isInit;
          uVar40._1_1_ = pMVar30->intKey;
          uVar40._2_1_ = pMVar30->intKeyLeaf;
          uVar40._3_1_ = pMVar30->field_0x3;
          local_270 = pMVar30;
          ptrmapPut(local_228,
                    uVar40 >> 0x18 | (uVar40 & 0xff0000) >> 8 | (uVar40 & 0xff00) << 8 |
                    uVar40 << 0x18,'\x05',pMVar41->pgno,&local_274);
          pMVar30 = local_270;
          uVar40 = (uint)local_208;
        }
        uVar12 = pMStack_f0->aiOvfl[(long)((long)&local_248[-1].xCellSize + 2)];
        if (uVar12 == 0) {
          local_270 = pMVar30;
          uVar12 = computeCellSize((CellArray *)(local_128 + 0x20),(int)local_248);
          pMVar30 = local_270;
          uVar40 = (uint)local_208;
        }
        if (pMVar41->minLocal < uVar12) {
          ptrmapPutOvflPtr(pMVar41,pMVar21,&pMVar30->isInit,&local_274);
          uVar40 = (uint)local_208;
        }
        pMVar33 = local_250;
        iVar15 = local_274;
        if (local_274 != 0) goto LAB_001663c9;
        pMVar33 = local_248;
        iVar15 = local_128._32_4_;
      }
      pMVar33 = (MemPage *)&pMVar33->intKey;
      local_270 = (MemPage *)CONCAT44(local_270._4_4_,iVar15);
    } while ((long)pMVar33 < (long)iVar15);
  }
  if ((char)local_230 != '\0') {
    local_248 = local_f8;
    local_260 = pMStack_f0;
    local_208 = (MemPage *)((ulong)local_258 & 0xffffffff);
    lVar25 = 0;
    iVar16 = 0;
LAB_00167314:
    pMVar21 = local_210;
    local_258 = (MemPage *)local_160[lVar25 + -1];
    uVar40 = local_1e4[lVar25 + -1];
    lVar34 = (long)(int)uVar40;
    pMVar33 = *(MemPage **)(local_248->aiOvfl + lVar34 * 4 + -0xe);
    uVar23 = (int)local_138 + (uint)local_260->aiOvfl[lVar34 + -0xe];
    pMVar41 = (MemPage *)(local_188 + iVar16);
    if (local_258->leaf == '\0') {
      *(uint *)(local_258->aData + 8) = *(uint *)pMVar33;
    }
    else if ((int)local_240 == 0) {
      pMVar33 = (MemPage *)((long)&pMVar33[-1].xParseCell + 4);
      if (local_260->aiOvfl[lVar34 + -0xe] == 4) {
        local_230 = pMVar41;
        uVar12 = (*local_210->xCellSize)(local_210,(u8 *)pMVar33);
        uVar23 = (uint)uVar12;
        pMVar41 = local_230;
      }
    }
    else {
      uVar40 = uVar40 - 1;
      (*local_258->xParseCell)(local_258,*(u8 **)(local_248->aiOvfl + lVar34 * 4 + -0x12),&local_98)
      ;
      iVar15 = sqlite3PutVarint((uchar *)&pMVar41->pgno,
                                CONCAT44(local_98.nKey._4_4_,(int)local_98.nKey));
      uVar23 = iVar15 + 4;
      pMVar33 = pMVar41;
      pMVar41 = (MemPage *)0x0;
      pMVar21 = local_210;
    }
    uVar47 = 0;
    do {
      uVar20 = uVar47 + 1;
      if (5 < uVar47) break;
      lVar34 = uVar47 * 4;
      uVar47 = uVar20;
    } while (*(int *)((long)&local_b8 + lVar34) <= (int)uVar40);
    if (((&pMStack_f0)[uVar20] < pMVar33) ||
       ((MemPage *)((long)pMVar33->aiOvfl + (long)(int)uVar23 + -0x1c) <= (&pMStack_f0)[uVar20])) {
      insertCell(pMVar21,(int)local_218 + (int)lVar25,&pMVar33->isInit,uVar23,&pMVar41->isInit,
                 local_258->pgno,&local_274);
      pMVar33 = local_250;
      iVar15 = local_274;
      if (local_274 == 0) goto code_r0x00167444;
    }
    else {
      uVar28 = 0x12b11;
LAB_00166d0b:
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar28);
      pMVar33 = local_250;
      iVar15 = 0xb;
    }
    goto LAB_001663c9;
  }
LAB_00167458:
  uVar40 = 1 - uVar36;
  pMVar21 = local_210;
  cVar11 = local_261;
  if ((int)uVar40 < (int)uVar36) {
    local_240 = CONCAT44(local_240._4_4_,(uint)((int)local_240 == 0));
    local_218 = CONCAT44(local_218._4_4_,local_1e8);
    iVar16 = uVar36 * 2 + -1;
    do {
      uVar23 = -uVar40;
      if (0 < (int)uVar40) {
        uVar23 = uVar40;
      }
      if (local_190[uVar23] == '\0') {
        if ((int)uVar40 < 0) {
          if (*(int *)((long)&local_1f0 + (long)(int)uVar23 * 4 + 4) <=
              *(int *)(local_128 + ((long)(int)uVar23 + -1) * 4)) goto LAB_001674cf;
        }
        else {
          if (uVar40 == 0) {
            iNew = 0;
            iVar15 = 0;
            iVar24 = (int)local_218;
          }
          else {
LAB_001674cf:
            if ((uint)local_80 < uVar23) {
              uVar47 = (ulong)(uVar23 - 1);
              iVar15 = (uint)local_270;
            }
            else {
              uVar47 = (ulong)(int)(uVar23 - 1);
              iVar15 = *(int *)(local_128 + uVar47 * 4) + (int)local_240;
            }
            iNew = local_1e4[uVar47 - 1] + (int)local_240;
            iVar24 = local_1e4[(ulong)uVar23 - 1] - iNew;
          }
          pMVar21 = (MemPage *)local_160[(ulong)uVar23 - 1];
          iVar15 = editPage(pMVar21,iVar15,iNew,iVar24,(CellArray *)(local_128 + 0x20));
          pMVar33 = local_250;
          if (iVar15 != 0) goto LAB_001663c9;
          local_190[uVar23] = '\x01';
          pMVar21->nFree = (uint)local_238 - auStack_1ac[(ulong)uVar23 + 1];
          pMVar21 = local_210;
          cVar11 = local_261;
        }
      }
      uVar40 = uVar40 + 1;
      iVar16 = iVar16 + -1;
    } while (iVar16 != 0);
  }
  pBVar42 = local_228;
  pMVar33 = local_250;
  local_274 = 0;
  if (((cVar11 == '\x01') && (pMVar21->nCell == 0)) &&
     (pMVar41 = (MemPage *)CONCAT44(local_168._4_4_,(int)local_168),
     (int)(uint)pMVar21->hdrOffset <= pMVar41->nFree)) {
    local_274 = defragmentPage(pMVar41,-1);
    copyNodeContent(pMVar41,pMVar21,&local_274);
    pMVar33 = local_250;
    iVar15 = local_274;
    if (local_274 == 0) {
      iVar15 = freePage2(pMVar41->pBt,pMVar41,pMVar41->pgno);
    }
  }
  else {
    iVar15 = 0;
    if (((byte)local_1f8 & (char)local_180 == '\0' & local_228->autoVacuum != '\0') == 1) {
      uVar47 = 0;
      do {
        uVar40 = *(uint *)(*(long *)(local_160[uVar47 - 1] + 0x50) + 8);
        ptrmapPut(pBVar42,uVar40 >> 0x18 | (uVar40 & 0xff0000) >> 8 | (uVar40 & 0xff00) << 8 |
                          uVar40 << 0x18,'\x05',*(Pgno *)(local_160[uVar47 - 1] + 4),&local_274);
        uVar47 = uVar47 + 1;
        iVar15 = local_274;
      } while (uVar38 != uVar47);
    }
  }
  iVar16 = (int)local_80;
  if ((int)uVar36 <= iVar16) {
    lVar25 = 0;
    do {
      if (iVar15 == 0) {
        pMVar21 = *(MemPage **)(local_1c8 + lVar25 * 8 + (long)(int)uVar36 * 8);
        iVar15 = freePage2(pMVar21->pBt,pMVar21,pMVar21->pgno);
      }
      lVar25 = lVar25 + 1;
    } while ((iVar16 - uVar36) + 1 != (int)lVar25);
  }
LAB_001663c9:
  if (local_f8 != (MemPage *)0x0) {
    sqlite3_free(local_f8);
  }
LAB_001663db:
  uVar47 = (ulong)local_1fc;
  uVar38 = 0;
  do {
    if (*(long *)(local_1c8 + uVar38 * 8) != 0) {
      sqlite3PagerUnrefNotNull(*(DbPage **)(*(long *)(local_1c8 + uVar38 * 8) + 0x70));
    }
    uVar38 = uVar38 + 1;
  } while (uVar47 != uVar38);
  pCur = stack0xfffffffffffffe50;
  if (0 < (int)uVar36) {
    uVar47 = 0;
    do {
      if (local_160[uVar47 - 1] != 0) {
        sqlite3PagerUnrefNotNull(*(DbPage **)(local_160[uVar47 - 1] + 0x70));
      }
      uVar47 = uVar47 + 1;
      pCur = stack0xfffffffffffffe50;
    } while (uVar36 != uVar47);
  }
LAB_00166434:
  if (local_1f0 != (u8 *)0x0) {
    pcache1Free(local_1f0);
  }
  local_1f0 = local_188;
LAB_00166456:
  pMVar33->nOverflow = '\0';
  sqlite3PagerUnrefNotNull(pMVar33->pDbPage);
  cVar11 = pCur->iPage + -1;
  pCur->iPage = cVar11;
  pMVar21 = pCur->apPage[cVar11];
LAB_00166479:
  pCur->pPage = pMVar21;
  pMVar33 = pMVar21;
  if (iVar15 != 0) {
LAB_0016786b:
    if (local_1f0 != (u8 *)0x0) {
      pcache1Free(local_1f0);
    }
    return iVar15;
  }
  goto LAB_00165d46;
code_r0x00167444:
  iVar16 = iVar16 + uVar23;
  lVar25 = lVar25 + 1;
  if ((MemPage *)lVar25 == local_208) goto LAB_00167458;
  goto LAB_00167314;
}

Assistant:

static int balance(BtCursor *pCur){
  int rc = SQLITE_OK;
  u8 aBalanceQuickSpace[13];
  u8 *pFree = 0;

  VVA_ONLY( int balance_quick_called = 0 );
  VVA_ONLY( int balance_deeper_called = 0 );

  do {
    int iPage;
    MemPage *pPage = pCur->pPage;

    if( NEVER(pPage->nFree<0) && btreeComputeFreeSpace(pPage) ) break;
    if( pPage->nOverflow==0 && pPage->nFree*3<=(int)pCur->pBt->usableSize*2 ){
      /* No rebalance required as long as:
      **   (1) There are no overflow cells
      **   (2) The amount of free space on the page is less than 2/3rds of
      **       the total usable space on the page. */
      break;
    }else if( (iPage = pCur->iPage)==0 ){
      if( pPage->nOverflow && (rc = anotherValidCursor(pCur))==SQLITE_OK ){
        /* The root page of the b-tree is overfull. In this case call the
        ** balance_deeper() function to create a new child for the root-page
        ** and copy the current contents of the root-page to it. The
        ** next iteration of the do-loop will balance the child page.
        */
        assert( balance_deeper_called==0 );
        VVA_ONLY( balance_deeper_called++ );
        rc = balance_deeper(pPage, &pCur->apPage[1]);
        if( rc==SQLITE_OK ){
          pCur->iPage = 1;
          pCur->ix = 0;
          pCur->aiIdx[0] = 0;
          pCur->apPage[0] = pPage;
          pCur->pPage = pCur->apPage[1];
          assert( pCur->pPage->nOverflow );
        }
      }else{
        break;
      }
    }else if( sqlite3PagerPageRefcount(pPage->pDbPage)>1 ){
      /* The page being written is not a root page, and there is currently
      ** more than one reference to it. This only happens if the page is one
      ** of its own ancestor pages. Corruption. */
      rc = SQLITE_CORRUPT_BKPT;
    }else{
      MemPage * const pParent = pCur->apPage[iPage-1];
      int const iIdx = pCur->aiIdx[iPage-1];

      rc = sqlite3PagerWrite(pParent->pDbPage);
      if( rc==SQLITE_OK && pParent->nFree<0 ){
        rc = btreeComputeFreeSpace(pParent);
      }
      if( rc==SQLITE_OK ){
#ifndef SQLITE_OMIT_QUICKBALANCE
        if( pPage->intKeyLeaf
         && pPage->nOverflow==1
         && pPage->aiOvfl[0]==pPage->nCell
         && pParent->pgno!=1
         && pParent->nCell==iIdx
        ){
          /* Call balance_quick() to create a new sibling of pPage on which
          ** to store the overflow cell. balance_quick() inserts a new cell
          ** into pParent, which may cause pParent overflow. If this
          ** happens, the next iteration of the do-loop will balance pParent
          ** use either balance_nonroot() or balance_deeper(). Until this
          ** happens, the overflow cell is stored in the aBalanceQuickSpace[]
          ** buffer.
          **
          ** The purpose of the following assert() is to check that only a
          ** single call to balance_quick() is made for each call to this
          ** function. If this were not verified, a subtle bug involving reuse
          ** of the aBalanceQuickSpace[] might sneak in.
          */
          assert( balance_quick_called==0 );
          VVA_ONLY( balance_quick_called++ );
          rc = balance_quick(pParent, pPage, aBalanceQuickSpace);
        }else
#endif
        {
          /* In this case, call balance_nonroot() to redistribute cells
          ** between pPage and up to 2 of its sibling pages. This involves
          ** modifying the contents of pParent, which may cause pParent to
          ** become overfull or underfull. The next iteration of the do-loop
          ** will balance the parent page to correct this.
          **
          ** If the parent page becomes overfull, the overflow cell or cells
          ** are stored in the pSpace buffer allocated immediately below.
          ** A subsequent iteration of the do-loop will deal with this by
          ** calling balance_nonroot() (balance_deeper() may be called first,
          ** but it doesn't deal with overflow cells - just moves them to a
          ** different page). Once this subsequent call to balance_nonroot()
          ** has completed, it is safe to release the pSpace buffer used by
          ** the previous call, as the overflow cell data will have been
          ** copied either into the body of a database page or into the new
          ** pSpace buffer passed to the latter call to balance_nonroot().
          */
          u8 *pSpace = sqlite3PageMalloc(pCur->pBt->pageSize);
          rc = balance_nonroot(pParent, iIdx, pSpace, iPage==1,
                               pCur->hints&BTREE_BULKLOAD);
          if( pFree ){
            /* If pFree is not NULL, it points to the pSpace buffer used
            ** by a previous call to balance_nonroot(). Its contents are
            ** now stored either on real database pages or within the
            ** new pSpace buffer, so it may be safely freed here. */
            sqlite3PageFree(pFree);
          }

          /* The pSpace buffer will be freed after the next call to
          ** balance_nonroot(), or just before this function returns, whichever
          ** comes first. */
          pFree = pSpace;
        }
      }

      pPage->nOverflow = 0;

      /* The next iteration of the do-loop balances the parent page. */
      releasePage(pPage);
      pCur->iPage--;
      assert( pCur->iPage>=0 );
      pCur->pPage = pCur->apPage[pCur->iPage];
    }
  }while( rc==SQLITE_OK );

  if( pFree ){
    sqlite3PageFree(pFree);
  }
  return rc;
}